

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_>::on_bin
          (int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *pbVar3;
  bin_writer<1> f;
  int num_digits;
  string_view prefix;
  undefined4 uStack_c;
  
  pbVar3 = this->specs;
  if ((char)pbVar3->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = pbVar3->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = count_digits<1u,unsigned_long>(this->abs_value);
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
            ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              *)this->writer,num_digits,prefix,*this->specs,f);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }